

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O1

optional_idx duckdb::GetStorageVersion(char *version_string)

{
  char *__s1;
  long lVar1;
  int iVar2;
  idx_t in_RAX;
  long lVar3;
  optional_idx local_28;
  
  local_28.index = in_RAX;
  iVar2 = strcmp("v0.0.4",version_string);
  if (iVar2 == 0) {
    optional_idx::optional_idx(&local_28,1);
  }
  else {
    lVar1 = 0x10;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x350) goto LAB_0114d183;
      __s1 = *(char **)(storage_version_info + lVar3);
      iVar2 = strcmp(__s1,version_string);
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    optional_idx::optional_idx(&local_28,*(idx_t *)(storage_version_info + lVar3 + 8));
    if (__s1 == (char *)0x0) {
LAB_0114d183:
      local_28.index = 0xffffffffffffffff;
    }
  }
  return (optional_idx)local_28.index;
}

Assistant:

optional_idx GetStorageVersion(const char *version_string) {
	for (idx_t i = 0; storage_version_info[i].version_name; i++) {
		if (!strcmp(storage_version_info[i].version_name, version_string)) {
			return storage_version_info[i].storage_version;
		}
	}
	return optional_idx();
}